

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O2

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationVectors
          (ON_AerialPhotoCameraPosition *this,ON_3dVector camera_up,ON_3dVector camera_right,
          ON_3dVector camera_direction)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ON_3dVector *pOVar7;
  double *pdVar8;
  byte bVar9;
  double dVar10;
  ON_Xform in_stack_fffffffffffffe58;
  ON_3dVector Y;
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dVector local_b0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar9 = 0;
  X.z = camera_right.z;
  X.x = camera_right.x;
  X.y = camera_right.y;
  Y.z = camera_up.z;
  Y.x = camera_up.x;
  Y.y = camera_up.y;
  ON_3dVector::operator-(&Z,&camera_direction);
  bVar3 = ON_3dVector::IsValid(&X);
  if (bVar3) {
    bVar3 = ON_3dVector::Unitize(&X);
  }
  else {
    bVar3 = false;
  }
  bVar4 = ON_3dVector::IsValid(&Y);
  if (bVar4) {
    bVar4 = ON_3dVector::Unitize(&Y);
  }
  else {
    bVar4 = false;
  }
  bVar5 = ON_3dVector::IsValid(&Z);
  if (bVar5) {
    bVar5 = ON_3dVector::Unitize(&Z);
    if ((bVar4 & bVar5) == 1 && bVar3 == false) {
      ON_CrossProduct(&local_b0,&Y,&Z);
      X.z = local_b0.z;
      X.x = local_b0.x;
      X.y = local_b0.y;
      bVar3 = ON_3dVector::Unitize(&X);
      if (!bVar3) goto LAB_00575da5;
      camera_right.z = X.z;
      camera_right.x = X.x;
      camera_right.y = X.y;
      bVar3 = true;
    }
    else {
      if ((bVar5 & bVar3) != 1 || bVar4 != false) goto LAB_00575ab2;
      ON_CrossProduct(&local_b0,&Z,&X);
      Y.z = local_b0.z;
      Y.x = local_b0.x;
      Y.y = local_b0.y;
      bVar4 = ON_3dVector::Unitize(&Y);
      if (!bVar4) goto LAB_00575da5;
      camera_up.z = Y.z;
      camera_up.x = Y.x;
      camera_up.y = Y.y;
      bVar4 = true;
    }
  }
  else {
    bVar5 = false;
LAB_00575ab2:
    if ((bVar3 & bVar4) == 1 && bVar5 == false) {
      ON_CrossProduct(&local_b0,&X,&Y);
      Z.z = local_b0.z;
      Z.x = local_b0.x;
      Z.y = local_b0.y;
      bVar5 = ON_3dVector::Unitize(&Z);
      if (!bVar5) goto LAB_00575da5;
      ON_3dVector::operator-(&local_b0,&Z);
      camera_direction.z = local_b0.z;
      camera_direction.x = local_b0.x;
      camera_direction.y = local_b0.y;
      bVar5 = true;
    }
  }
  if ((bVar3 & bVar4 & bVar5) == 1) {
    dVar1 = ON_3dVector::operator*(&X,&Y);
    dVar10 = 0.0;
    if (dVar1 != 0.0) {
      dVar10 = ABS(dVar1);
    }
    dVar1 = ON_3dVector::operator*(&Y,&Z);
    dVar2 = ABS(dVar1);
    if (ABS(dVar1) <= dVar10) {
      dVar2 = dVar10;
    }
    dVar1 = ON_3dVector::operator*(&Z,&X);
    dVar10 = ABS(dVar1);
    if (ABS(dVar1) <= dVar2) {
      dVar10 = dVar2;
    }
    if (dVar10 <= 1e-08) {
      ON_CrossProduct(&local_b0,&X,&Y);
      dVar1 = ON_3dVector::operator*(&Z,&local_b0);
      if (0.0 < dVar1) {
        ON_Xform::ON_Xform((ON_Xform *)&local_b0);
        local_b0.x = X.x;
        local_b0.y = Y.x;
        local_b0.z = Z.x;
        local_98 = 0;
        local_90 = X.y;
        local_88 = Y.y;
        local_80 = Z.y;
        local_78 = 0;
        local_70 = X.z;
        local_68 = Y.z;
        local_60 = Z.z;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_38 = 0x3ff0000000000000;
        pOVar7 = &local_b0;
        pdVar8 = (double *)&stack0xfffffffffffffe58;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pdVar8 = (*(double (*) [4])&pOVar7->x)[0];
          pOVar7 = (ON_3dVector *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          pdVar8 = pdVar8 + (ulong)bVar9 * -2 + 1;
        }
        SetOrientationRotation(this,in_stack_fffffffffffffe58);
        (this->m_orientation_right).z = camera_right.z;
        (this->m_orientation_right).x = camera_right.x;
        (this->m_orientation_right).y = camera_right.y;
        (this->m_orientation_up).x = camera_up.x;
        (this->m_orientation_up).y = camera_up.y;
        (this->m_orientation_up).z = camera_up.z;
        (this->m_orientation_direction).x = camera_direction.x;
        (this->m_orientation_direction).y = camera_direction.y;
        (this->m_orientation_direction).z = camera_direction.z;
        return true;
      }
    }
  }
LAB_00575da5:
  UnsetOrientation(this);
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationVectors(
    ON_3dVector camera_up,
    ON_3dVector camera_right,
    ON_3dVector camera_direction
    )
{
  ON_3dVector X(camera_right);
  ON_3dVector Y(camera_up);
  ON_3dVector Z(-camera_direction);

  bool bHaveX = ( X.IsValid() && X.Unitize() );
  bool bHaveY = ( Y.IsValid() && Y.Unitize() );
  bool bHaveZ = ( Z.IsValid() && Z.Unitize() );
  
  if ( !bHaveX && bHaveY && bHaveZ )
  {
    X = ON_CrossProduct(Y,Z);
    bHaveX = X.Unitize();
    if ( bHaveX )
      camera_right = X;
  }
  else if ( !bHaveY && bHaveZ && bHaveX )
  {
    Y = ON_CrossProduct(Z,X);
    bHaveY = Y.Unitize();
    if ( bHaveY )
      camera_up = Y;
  }
  else if ( !bHaveZ && bHaveX && bHaveY )
  {
    Z = ON_CrossProduct(X,Y);
    bHaveZ = Z.Unitize();
    if ( bHaveZ )
      camera_direction = -Z;
  }

  bool rc = false;
  for (;;)
  {
    if ( !bHaveX || !bHaveY || !bHaveZ )
      break;

    double max_dot = 0.0;
    double d = fabs(X*Y);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Y*Z);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Z*X);
    if ( d > max_dot )
      max_dot = d;

    if ( max_dot > 1.0e-8 )
      break;

    d = Z*ON_CrossProduct(X,Y);
    if ( !(d > 0.0) )
      break;

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    rc = SetOrientationRotation(R);

    if (rc)
    {
      // preserve exact values of input parameters
      m_orientation_right = camera_right;
      m_orientation_up = camera_up;
      m_orientation_direction = camera_direction;
    }

    break;
  }

  if (!rc)
  {
    UnsetOrientation();
  }

  return rc;
}